

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

timespec absl::lts_20240722::ToTimespec(Time t)

{
  timespec tVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  uint32_t in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Time t_00;
  Duration d_00;
  Duration DVar5;
  Duration DVar6;
  undefined8 local_70;
  undefined4 local_68;
  Duration d;
  Time t_local;
  timespec ts;
  undefined8 extraout_RDX_01;
  
  t_00.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
  t_00.rep_.rep_hi_.hi_ = 0;
  t_00.rep_.rep_lo_ = in_EDX;
  DVar5 = time_internal::ToUnixDuration((time_internal *)t.rep_.rep_hi_,t_00);
  local_70 = DVar5.rep_hi_;
  local_68 = DVar5.rep_lo_;
  bVar2 = time_internal::IsInfiniteDuration(DVar5);
  if (!bVar2) {
    DVar6.rep_hi_.hi_ = 0;
    DVar6.rep_hi_.lo_ = local_68;
    DVar6.rep_lo_ = (uint32_t)extraout_RDX;
    register0x00000000 = time_internal::GetRepHi((time_internal *)local_70,DVar6);
    d_00.rep_hi_.hi_ = 0;
    d_00.rep_hi_.lo_ = local_68;
    d_00.rep_lo_ = (uint32_t)extraout_RDX_00;
    iVar4 = time_internal::GetRepHi((time_internal *)local_70,d_00);
    if (register0x00000000 == iVar4) {
      DVar5.rep_hi_.hi_ = 0;
      DVar5.rep_hi_.lo_ = local_68;
      DVar5.rep_lo_ = (uint32_t)extraout_RDX_01;
      uVar3 = time_internal::GetRepLo((time_internal *)local_70,DVar5);
      ts.tv_sec = (__time_t)(uVar3 >> 2);
      goto LAB_00124fa0;
    }
  }
  DVar6 = ZeroDuration();
  bVar2 = operator>=(DVar5,DVar6);
  if (bVar2) {
    register0x00000000 = std::numeric_limits<long>::max();
    ts.tv_sec = 999999999;
  }
  else {
    register0x00000000 = std::numeric_limits<long>::min();
    ts.tv_sec = 0;
  }
LAB_00124fa0:
  tVar1.tv_nsec = ts.tv_sec;
  tVar1.tv_sec = stack0xffffffffffffffe8;
  return tVar1;
}

Assistant:

timespec ToTimespec(Time t) {
  timespec ts;
  absl::Duration d = time_internal::ToUnixDuration(t);
  if (!time_internal::IsInfiniteDuration(d)) {
    ts.tv_sec = static_cast<decltype(ts.tv_sec)>(time_internal::GetRepHi(d));
    if (ts.tv_sec == time_internal::GetRepHi(d)) {  // no time_t narrowing
      ts.tv_nsec = time_internal::GetRepLo(d) / 4;  // floor
      return ts;
    }
  }
  if (d >= absl::ZeroDuration()) {
    ts.tv_sec = std::numeric_limits<time_t>::max();
    ts.tv_nsec = 1000 * 1000 * 1000 - 1;
  } else {
    ts.tv_sec = std::numeric_limits<time_t>::min();
    ts.tv_nsec = 0;
  }
  return ts;
}